

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

Maybe<kj::Own<const_kj::Directory>_> __thiscall
kj::anon_unknown_8::DiskDirectory::tryOpenSubdir(DiskDirectory *this,PathPtr path,WriteMode mode)

{
  bool bVar1;
  undefined4 in_register_0000000c;
  Directory *extraout_RDX;
  Directory *extraout_RDX_00;
  Directory *pDVar2;
  WriteMode in_R8D;
  size_t *this_00;
  Maybe<kj::Own<const_kj::Directory>_> MVar3;
  PathPtr path_00;
  PathPtr path_01;
  NullableValue<kj::AutoCloseFd> local_44;
  Own<kj::Directory> local_38;
  
  path_00.parts.size_ = CONCAT44(in_register_0000000c,mode);
  path_00.parts.ptr = (String *)path.parts.size_;
  this_00 = &((path.parts.ptr)->content).size_;
  if ((in_R8D & CREATE) != 0) {
    path_01.parts.size_ = path_00.parts.size_;
    path_01.parts.ptr = path_00.parts.ptr;
    bVar1 = DiskHandle::tryMkdir((DiskHandle *)this_00,path_01,in_R8D,false);
    if (!bVar1) {
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      (this->super_DiskHandle).fd = (AutoCloseFd)0x0;
      pDVar2 = extraout_RDX;
      goto LAB_004c3126;
    }
  }
  DiskHandle::tryOpenSubdirInternal
            ((Maybe<kj::AutoCloseFd> *)&local_44,(DiskHandle *)this_00,path_00);
  Maybe<kj::AutoCloseFd>::map<kj::Own<kj::Directory>_(&)(kj::AutoCloseFd)>
            ((Maybe<kj::AutoCloseFd> *)&local_38,(_func_Own<kj::Directory>_AutoCloseFd *)&local_44);
  (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
       (_func_int **)local_38.disposer;
  (this->super_DiskHandle).fd = (AutoCloseFd)local_38.ptr;
  local_38.ptr = (Directory *)0x0;
  Own<kj::Directory>::dispose(&local_38);
  kj::_::NullableValue<kj::AutoCloseFd>::~NullableValue(&local_44);
  pDVar2 = extraout_RDX_00;
LAB_004c3126:
  MVar3.ptr.ptr = pDVar2;
  MVar3.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::Directory>_>)MVar3.ptr;
}

Assistant:

Maybe<Own<const Directory>> tryOpenSubdir(PathPtr path, WriteMode mode) const override {
    return DiskHandle::tryOpenSubdir(path, mode);
  }